

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void nni_sha1_process(nni_sha1_ctx *ctx)

{
  int iVar1;
  long lVar2;
  int local_1a4;
  int local_1a0;
  int t_5;
  int t_4;
  int t_3;
  int t_2;
  int t_1;
  int t;
  uint E;
  uint D;
  uint C;
  uint B;
  uint A;
  uint W [80];
  uint temp;
  uint K [4];
  nni_sha1_ctx *ctx_local;
  
  for (t_2 = 0; t_2 < 0x10; t_2 = t_2 + 1) {
    (&B)[t_2] = (uint)ctx->blk[t_2 << 2] << 0x18;
    (&B)[t_2] = (uint)ctx->blk[t_2 * 4 + 1] << 0x10 | (&B)[t_2];
    (&B)[t_2] = (uint)ctx->blk[t_2 * 4 + 2] << 8 | (&B)[t_2];
    (&B)[t_2] = (uint)ctx->blk[t_2 * 4 + 3] | (&B)[t_2];
  }
  for (t_3 = 0x10; t_3 < 0x50; t_3 = t_3 + 1) {
    (&B)[t_3] = ((&B)[t_3 + -3] ^ (&B)[t_3 + -8] ^ (&B)[t_3 + -0xe] ^ (&B)[t_3 + -0x10]) << 1 |
                ((&B)[t_3 + -3] ^ (&B)[t_3 + -8] ^ (&B)[t_3 + -0xe] ^ (&B)[t_3 + -0x10]) >> 0x1f;
  }
  D = ctx->digest[1];
  E = ctx->digest[2];
  t = ctx->digest[3];
  t_1 = ctx->digest[4];
  C = ctx->digest[0];
  for (t_4 = 0; t_4 < 0x14; t_4 = t_4 + 1) {
    iVar1 = (C << 5 | C >> 0x1b) + (D & E | (D ^ 0xffffffff) & t) + t_1;
    lVar2 = (long)t_4;
    t_1 = t;
    t = E;
    E = D << 0x1e | D >> 2;
    D = C;
    C = iVar1 + (&B)[lVar2] + 0x5a827999;
  }
  for (t_5 = 0x14; t_5 < 0x28; t_5 = t_5 + 1) {
    iVar1 = (C << 5 | C >> 0x1b) + (D ^ E ^ t) + t_1;
    lVar2 = (long)t_5;
    t_1 = t;
    t = E;
    E = D << 0x1e | D >> 2;
    D = C;
    C = iVar1 + (&B)[lVar2] + 0x6ed9eba1;
  }
  for (local_1a0 = 0x28; local_1a0 < 0x3c; local_1a0 = local_1a0 + 1) {
    iVar1 = (C << 5 | C >> 0x1b) + (D & (E | t) | E & t) + t_1;
    lVar2 = (long)local_1a0;
    t_1 = t;
    t = E;
    E = D << 0x1e | D >> 2;
    D = C;
    C = iVar1 + (&B)[lVar2] + 0x8f1bbcdc;
  }
  for (local_1a4 = 0x3c; local_1a4 < 0x50; local_1a4 = local_1a4 + 1) {
    iVar1 = (C << 5 | C >> 0x1b) + (D ^ E ^ t) + t_1;
    lVar2 = (long)local_1a4;
    t_1 = t;
    t = E;
    E = D << 0x1e | D >> 2;
    D = C;
    C = iVar1 + (&B)[lVar2] + 0xca62c1d6;
  }
  ctx->digest[0] = ctx->digest[0] + C;
  ctx->digest[1] = ctx->digest[1] + D;
  ctx->digest[2] = ctx->digest[2] + E;
  ctx->digest[3] = ctx->digest[3] + t;
  ctx->digest[4] = ctx->digest[4] + t_1;
  ctx->idx = 0;
  return;
}

Assistant:

void
nni_sha1_process(nni_sha1_ctx *ctx)
{
	const unsigned K[] = // Constants defined in SHA-1
	    { 0x5A827999, 0x6ED9EBA1, 0x8F1BBCDC, 0xCA62C1D6 };
	unsigned temp;          // Temporary word value
	unsigned W[80];         // Word sequence
	unsigned A, B, C, D, E; // Word buffers

	// Initialize the first 16 words in the array W
	for (int t = 0; t < 16; t++) {
		W[t] = ((unsigned) ctx->blk[t * 4]) << 24;
		W[t] |= ((unsigned) ctx->blk[t * 4 + 1]) << 16;
		W[t] |= ((unsigned) ctx->blk[t * 4 + 2]) << 8;
		W[t] |= ((unsigned) ctx->blk[t * 4 + 3]);
	}

	for (int t = 16; t < 80; t++) {
		W[t] = nni_sha1_circular_shift(
		    1, W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16]);
	}

	A = ctx->digest[0];
	B = ctx->digest[1];
	C = ctx->digest[2];
	D = ctx->digest[3];
	E = ctx->digest[4];

	for (int t = 0; t < 20; t++) {
		temp = nni_sha1_circular_shift(5, A) + ((B & C) | ((~B) & D)) +
		    E + W[t] + K[0];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	for (int t = 20; t < 40; t++) {
		temp = nni_sha1_circular_shift(5, A) + (B ^ C ^ D) + E + W[t] +
		    K[1];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	for (int t = 40; t < 60; t++) {
		temp = nni_sha1_circular_shift(5, A) +
		    ((B & C) | (B & D) | (C & D)) + E + W[t] + K[2];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	for (int t = 60; t < 80; t++) {
		temp = nni_sha1_circular_shift(5, A) + (B ^ C ^ D) + E + W[t] +
		    K[3];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	ctx->digest[0] = (ctx->digest[0] + A) & 0xFFFFFFFF;
	ctx->digest[1] = (ctx->digest[1] + B) & 0xFFFFFFFF;
	ctx->digest[2] = (ctx->digest[2] + C) & 0xFFFFFFFF;
	ctx->digest[3] = (ctx->digest[3] + D) & 0xFFFFFFFF;
	ctx->digest[4] = (ctx->digest[4] + E) & 0xFFFFFFFF;

	ctx->idx = 0;
}